

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

PackedSlice * __thiscall
kratos::VarPackedStruct::operator[](VarPackedStruct *this,string *member_name)

{
  uint32_t uVar1;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  VarPackedStruct *local_78;
  undefined8 uStack_70;
  VarPackedStruct *local_60;
  undefined8 uStack_58;
  undefined1 local_40 [8];
  shared_ptr<kratos::PackedSlice> ptr;
  
  uVar1 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
  if (uVar1 == (this->super_Var).var_width_) {
    local_60 = this;
    std::__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::PackedSlice>,kratos::VarPackedStruct*,std::__cxx11::string_const&>
              ((__shared_ptr<kratos::PackedSlice,(__gnu_cxx::_Lock_policy)2> *)local_40,
               (allocator<kratos::PackedSlice> *)&local_78,&local_60,member_name);
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::emplace_back<std::shared_ptr<kratos::PackedSlice>&>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)&(this->super_Var).slices_,(shared_ptr<kratos::PackedSlice> *)local_40);
    if (ptr.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ptr.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return (PackedSlice *)local_40;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_60,this);
  local_78 = local_60;
  uStack_70 = uStack_58;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x31;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_40,(detail *)"Unable to access member of {0}, which is an array",
             format_str,args);
  UserException::UserException(this_00,(string *)local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PackedSlice &VarPackedStruct::operator[](const std::string &member_name) {
    if (width() != var_width())
        throw UserException(
            ::format("Unable to access member of {0}, which is an array", to_string()));
    auto ptr = std::make_shared<PackedSlice>(this, member_name);
    slices_.emplace_back(ptr);
    return *ptr;
}